

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.h
# Opt level: O3

void __thiscall
assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[7]>
          (asmcode *this,operation *val,char (*val_1) [7])

{
  operation oVar1;
  size_t sVar2;
  instruction ins;
  long *local_80 [2];
  long local_70 [2];
  instruction local_60;
  
  oVar1 = *val;
  local_80[0] = local_70;
  sVar2 = strlen(*val_1);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,val_1,*val_1 + sVar2);
  assembler::asmcode::instruction::instruction(&local_60,oVar1,(string *)local_80);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>::
  push_back((vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
             *)(*(long *)(*(long *)(this + 0x20) + -8) + 0x10),&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.text._M_dataplus._M_p != &local_60.text.field_2) {
    operator_delete(local_60.text._M_dataplus._M_p,local_60.text.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add(T&&... val)
      {
      instruction ins(std::forward<T>(val)...);
      (*instructions_list_stack.back()).push_back(ins);
      }